

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::normal3f>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *result)

{
  pointer *ppnVar1;
  pointer pnVar2;
  iterator iVar3;
  StreamReader *pSVar4;
  bool bVar5;
  ulong uVar6;
  char cVar7;
  char c;
  normal3f value;
  float3 v;
  char local_5d;
  undefined8 local_5c;
  undefined1 local_50 [8];
  float fStack_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pnVar2 = (result->
           super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>).
      _M_impl.super__Vector_impl_data._M_finish != pnVar2) {
    (result->
    super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>).
    _M_impl.super__Vector_impl_data._M_finish = pnVar2;
  }
  bVar5 = SkipWhitespaceAndNewline(this,true);
  if (bVar5) {
    bVar5 = ParseBasicTypeTuple<float,3ul>(this,(array<float,_3UL> *)local_50);
    if (bVar5) {
      local_5c._0_4_ = (float)local_50._0_4_;
      local_5c._4_4_ = (float)local_50._4_4_;
      iVar3._M_current =
           (result->
           super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->
          super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>)
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>::
        _M_realloc_insert<tinyusdz::value::normal3f_const&>
                  ((vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>> *)
                   result,iVar3,(normal3f *)&local_5c);
      }
      else {
        (iVar3._M_current)->z = fStack_48;
        (iVar3._M_current)->x = (float)local_50._0_4_;
        (iVar3._M_current)->y = (float)local_50._4_4_;
        ppnVar1 = &(result->
                   super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppnVar1 = *ppnVar1 + 1;
      }
    }
    else {
      local_50 = (undefined1  [8])&local_40;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Not starting with the value of requested type.\n","");
      PushError(this,(string *)local_50);
      if (local_50 != (undefined1  [8])&local_40) {
        operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
      }
    }
    if (bVar5) {
      do {
        pSVar4 = this->_sr;
        if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
        goto LAB_003957eb;
        bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar5) {
          return false;
        }
        bVar5 = Char1(this,&local_5d);
        cVar7 = '\x01';
        if (bVar5) {
          if (local_5d == sep) {
            bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
            if (bVar5) {
              bVar5 = LookChar1(this,local_50);
              cVar7 = (local_50[0] == end_symbol) * '\x03';
              if (!bVar5) {
                cVar7 = '\x01';
              }
              if (local_50[0] != end_symbol && bVar5) goto LAB_0039573a;
            }
          }
          else {
LAB_0039573a:
            if (local_5d == sep) {
              cVar7 = '\x01';
              bVar5 = SkipWhitespaceAndNewline(this,true);
              if (bVar5) {
                bVar5 = ParseBasicTypeTuple<float,3ul>(this,(array<float,_3UL> *)local_50);
                if (bVar5) {
                  iVar3._M_current =
                       (result->
                       super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
                  local_5c = local_50;
                  if (iVar3._M_current ==
                      (result->
                      super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    ::std::
                    vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>::
                    _M_realloc_insert<tinyusdz::value::normal3f_const&>
                              ((vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>
                                *)result,iVar3,(normal3f *)&local_5c);
                  }
                  else {
                    (iVar3._M_current)->z = fStack_48;
                    (iVar3._M_current)->x = (float)local_50._0_4_;
                    (iVar3._M_current)->y = (float)local_50._4_4_;
                    ppnVar1 = &(result->
                               super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                    *ppnVar1 = *ppnVar1 + 1;
                  }
                  cVar7 = '\0';
                }
                else {
                  cVar7 = '\x03';
                }
              }
            }
            else {
              pSVar4 = this->_sr;
              cVar7 = '\x03';
              if ((0 < (long)pSVar4->idx_) && (uVar6 = pSVar4->idx_ - 1, uVar6 <= pSVar4->length_))
              {
                pSVar4->idx_ = uVar6;
              }
            }
          }
        }
      } while (cVar7 == '\0');
      if (cVar7 != '\x01') {
LAB_003957eb:
        if ((result->
            super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
            )._M_impl.super__Vector_impl_data._M_start !=
            (result->
            super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        local_50 = (undefined1  [8])&local_40;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Empty array.\n","");
        PushError(this,(string *)local_50);
        if (local_50 != (undefined1  [8])&local_40) {
          operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}